

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

uLong crc32_combine_(uLong crc1,uLong crc2,off64_t len2)

{
  bool bVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long odd [32];
  unsigned_long even [32];
  
  if (0 < len2) {
    odd[0] = 0xedb88320;
    uVar2 = 1;
    uVar3 = uVar2;
    for (; uVar2 != 0x20; uVar2 = uVar2 + 1) {
      odd[uVar2] = uVar3;
      uVar3 = uVar3 * 2;
    }
    gf2_matrix_square(even,odd);
    gf2_matrix_square(odd,even);
    do {
      gf2_matrix_square(even,odd);
      if ((len2 & 1U) != 0) {
        crc1 = gf2_matrix_times(even,crc1);
      }
      if ((ulong)len2 < 2) break;
      gf2_matrix_square(odd,even);
      if ((len2 & 2U) != 0) {
        crc1 = gf2_matrix_times(odd,crc1);
      }
      bVar1 = 3 < (ulong)len2;
      len2 = (ulong)len2 >> 2;
    } while (bVar1);
    crc1 = crc1 ^ crc2;
  }
  return crc1;
}

Assistant:

local uLong crc32_combine_(crc1, crc2, len2)
    uLong crc1;
    uLong crc2;
    z_off64_t len2;
{
    int n;
    unsigned long row;
    unsigned long even[GF2_DIM];    /* even-power-of-two zeros operator */
    unsigned long odd[GF2_DIM];     /* odd-power-of-two zeros operator */

    /* degenerate case (also disallow negative lengths) */
    if (len2 <= 0)
        return crc1;

    /* put operator for one zero bit in odd */
    odd[0] = 0xedb88320UL;          /* CRC-32 polynomial */
    row = 1;
    for (n = 1; n < GF2_DIM; n++) {
        odd[n] = row;
        row <<= 1;
    }

    /* put operator for two zero bits in even */
    gf2_matrix_square(even, odd);

    /* put operator for four zero bits in odd */
    gf2_matrix_square(odd, even);

    /* apply len2 zeros to crc1 (first square will put the operator for one
       zero byte, eight zero bits, in even) */
    do {
        /* apply zeros operator for this bit of len2 */
        gf2_matrix_square(even, odd);
        if (len2 & 1)
            crc1 = gf2_matrix_times(even, crc1);
        len2 >>= 1;

        /* if no more bits set, then done */
        if (len2 == 0)
            break;

        /* another iteration of the loop with odd and even swapped */
        gf2_matrix_square(odd, even);
        if (len2 & 1)
            crc1 = gf2_matrix_times(odd, crc1);
        len2 >>= 1;

        /* if no more bits set, then done */
    } while (len2 != 0);

    /* return combined crc */
    crc1 ^= crc2;
    return crc1;
}